

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

Element * __thiscall
Rml::Element::InsertBefore(Element *this,ElementPtr *child,Element *adjacent_element)

{
  Element **ppEVar1;
  code *pcVar2;
  bool bVar3;
  Element *stacking_context_parent;
  ulong uVar4;
  Element *pEVar5;
  Element *pEVar6;
  long lVar7;
  pointer puVar8;
  uint uVar9;
  long lVar10;
  Element *pEVar11;
  _Head_base<0UL,_Rml::Element_*,_false> local_30;
  
  if (((child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl == (Element *)0x0) &&
     (bVar3 = Assert("RMLUI_ASSERT(child)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x551), !bVar3)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if (adjacent_element != (Element *)0x0) {
    puVar8 = (this->children).
             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->children).
                  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
    if (uVar4 != 0) {
      lVar10 = 0;
      lVar7 = 0;
      do {
        if ((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
            puVar8[lVar7]._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
            _M_t == (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)adjacent_element
           ) {
          pEVar5 = (child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                   _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
          if ((int)lVar7 < (int)(uVar4 >> 3) - this->num_non_dom_children) {
            (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])(this);
            puVar8 = (this->children).
                     super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            this->num_non_dom_children = this->num_non_dom_children + 1;
          }
          ::std::
          vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
          ::_M_insert_rval(&this->children,
                           (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                           ((long)puVar8 - lVar10),child);
          SetParent(pEVar5,this);
          pEVar11 = pEVar5;
          uVar9 = 0;
          goto LAB_0021aa33;
        }
        lVar7 = lVar7 + 1;
        lVar10 = lVar10 + -8;
      } while (((long)uVar4 >> 3) + (ulong)((long)uVar4 >> 3 == 0) != lVar7);
    }
  }
  local_30._M_head_impl =
       (child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  (child->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  pEVar5 = AppendChild(this,(ElementPtr *)&local_30,true);
  if (local_30._M_head_impl == (Element *)0x0) {
    return pEVar5;
  }
  (*((local_30._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
  return pEVar5;
  while (bVar3 = uVar9 < 2, uVar9 = uVar9 + 1, bVar3) {
LAB_0021aa33:
    (*(pEVar11->super_ScriptInterface).super_Releasable._vptr_Releasable[0x13])(pEVar11,pEVar5);
    pEVar11 = pEVar11->parent;
    pEVar6 = this;
    if (pEVar11 == (Element *)0x0) break;
  }
  do {
    if (pEVar6->local_stacking_context != false) {
      pEVar6->stacking_context_dirty = true;
      break;
    }
    ppEVar1 = &pEVar6->parent;
    pEVar6 = *ppEVar1;
  } while (*ppEVar1 != (Element *)0x0);
  this->field_0x17 = this->field_0x17 | 2;
  return pEVar5;
}

Assistant:

Element* Element::InsertBefore(ElementPtr child, Element* adjacent_element)
{
	RMLUI_ASSERT(child);
	// Find the position in the list of children of the adjacent element. If
	// it's nullptr or we can't find it, then we insert it at the end of the dom
	// children, as a dom element.
	size_t child_index = 0;
	bool found_child = false;
	if (adjacent_element)
	{
		for (child_index = 0; child_index < children.size(); child_index++)
		{
			if (children[child_index].get() == adjacent_element)
			{
				found_child = true;
				break;
			}
		}
	}

	Element* child_ptr = nullptr;

	if (found_child)
	{
		child_ptr = child.get();

		if ((int)child_index >= GetNumChildren())
			num_non_dom_children++;
		else
			DirtyLayout();

		children.insert(children.begin() + child_index, std::move(child));
		child_ptr->SetParent(this);

		Element* ancestor = child_ptr;
		for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
			ancestor->OnChildAdd(child_ptr);

		DirtyStackingContext();
		DirtyDefinition(DirtyNodes::Self);
	}
	else
	{
		child_ptr = AppendChild(std::move(child));
	}

	return child_ptr;
}